

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwo.cpp
# Opt level: O1

void __thiscall chrono::ChConstraintTwo::ArchiveIN(ChConstraintTwo *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChConstraintTwo>(marchive);
  ChConstraint::ArchiveIN(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintTwo::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintTwo>();

    // deserialize the parent class data too
    ChConstraint::ArchiveIN(marchive);

    // stream in all member data:
    // NOTHING INTERESTING TO SERIALIZE (pointers to variables must be rebound in run-time.)
}